

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void luaNewLib<7ul>(lua_State *L,luaL_Reg (*funcs) [7])

{
  luaL_Reg (*funcs_local) [7];
  lua_State *L_local;
  
  luaL_checkversion_(0x407f700000000000,L,0x88);
  lua_createtable(L,0,6);
  luaL_setfuncs(L,funcs,0);
  return;
}

Assistant:

void luaNewLib(lua_State *L, const luaL_Reg (&funcs)[N]) {
#if LUA_VERSION_NUM >= 502
	luaL_newlib(L, funcs);
#else
	lua_createtable(L, 0, N - 1);
	luaL_register(L, nullptr, funcs);
#endif
}